

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall
groundupdbext::EmbeddedDatabase::Impl::Impl
          (Impl *this,string *dbname,string *fullpath,
          unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
          *kvStore,unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                   *indexStore)

{
  pointer pKVar1;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
  *indexStore_local;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
  *kvStore_local;
  string *fullpath_local;
  string *dbname_local;
  Impl *this_local;
  
  groundupdb::IDatabase::IDatabase(&this->super_IDatabase);
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)&PTR__Impl_0019ba38;
  std::__cxx11::string::string((string *)&this->m_name,(string *)dbname);
  std::__cxx11::string::string((string *)&this->m_fullpath,(string *)fullpath);
  pKVar1 = std::
           unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
           release(kvStore);
  std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>::
  unique_ptr<std::default_delete<groundupdb::KeyValueStore>,void>
            ((unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>> *
             )&this->m_keyValueStore,pKVar1);
  pKVar1 = std::
           unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>::
           release(indexStore);
  std::unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>>::
  unique_ptr<std::default_delete<groundupdb::KeyValueStore>,void>
            ((unique_ptr<groundupdb::KeyValueStore,std::default_delete<groundupdb::KeyValueStore>> *
             )&this->m_indexStore,pKVar1);
  return;
}

Assistant:

EmbeddedDatabase::Impl::Impl(std::string dbname, std::string fullpath,
     std::unique_ptr<KeyValueStore>& kvStore, std::unique_ptr<KeyValueStore>& indexStore)
  : m_name(dbname), m_fullpath(fullpath), m_keyValueStore(kvStore.release()), m_indexStore(indexStore.release())
{
  ;
}